

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deadline_timer_service.hpp
# Opt level: O0

void __thiscall
boost::asio::detail::
deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
::deadline_timer_service
          (deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
           *this,io_context *io_context)

{
  epoll_reactor *peVar1;
  undefined8 *in_RDI;
  timer_queue<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  *in_stack_ffffffffffffffb8;
  timer_queue<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  *in_stack_ffffffffffffffc0;
  epoll_reactor *this_00;
  
  service_base<boost::asio::detail::deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>
  ::service_base((service_base<boost::asio::detail::deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>
                  *)in_stack_ffffffffffffffc0,(io_context *)in_stack_ffffffffffffffb8);
  *in_RDI = &PTR__deadline_timer_service_00150a50;
  timer_queue<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  ::timer_queue(in_stack_ffffffffffffffc0);
  this_00 = (epoll_reactor *)(in_RDI + 0xb);
  peVar1 = use_service<boost::asio::detail::epoll_reactor>((io_context *)0x13c5d9);
  (this_00->super_execution_context_service_base<boost::asio::detail::epoll_reactor>).super_service.
  _vptr_service = (_func_int **)peVar1;
  epoll_reactor::init_task((epoll_reactor *)0x13c5fb);
  epoll_reactor::
  add_timer_queue<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,boost::asio::wait_traits<std::chrono::_V2::steady_clock>>>
            (this_00,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

deadline_timer_service(boost::asio::io_context& io_context)
    : service_base<deadline_timer_service<Time_Traits> >(io_context),
      scheduler_(boost::asio::use_service<timer_scheduler>(io_context))
  {
    scheduler_.init_task();
    scheduler_.add_timer_queue(timer_queue_);
  }